

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_builder.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::subject::SubjectBuilder::GetComponent
          (string *__return_storage_ptr__,SubjectBuilder *this,string *key)

{
  __type _Var1;
  reference pvVar2;
  size_type __n;
  allocator<char> local_21;
  
  __n = 1;
  while( true ) {
    if ((ulong)((long)(this->components_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->components_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n - 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_21);
      return __return_storage_ptr__;
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->components_,__n - 1);
    _Var1 = std::operator==(pvVar2,key);
    if (_Var1) break;
    __n = __n + 2;
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&this->components_,__n);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectBuilder::GetComponent(const std::string& key)
{
    for (unsigned long i = 0; i < components_.size(); i+= 2)
    {
        if ((components_.at(i)) == key)
        {
            return components_.at(i + 1);
        }
    }

    return "";
}